

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_parrec
          (CImg<unsigned_char> *this,char *filename,char axis,float align)

{
  CImg<unsigned_char> *pCVar1;
  CImgList<unsigned_char> list;
  CImgList<unsigned_char> local_48;
  CImg<unsigned_char> local_30;
  
  local_48._width = 0;
  local_48._allocated_width = 0;
  local_48._data = (CImg<unsigned_char> *)0x0;
  CImgList<unsigned_char>::load_parrec(&local_48,filename);
  if (local_48._width == 1) {
    pCVar1 = move_to(local_48._data,this);
  }
  else {
    CImgList<unsigned_char>::get_append(&local_30,&local_48,axis,align);
    pCVar1 = assign(this,local_30._data,local_30._width,local_30._height,local_30._depth,
                    local_30._spectrum);
    if ((local_30._is_shared == false) && (local_30._data != (uchar *)0x0)) {
      operator_delete__(local_30._data);
    }
  }
  CImgList<unsigned_char>::~CImgList(&local_48);
  return pCVar1;
}

Assistant:

CImg<T>& load_parrec(const char *const filename, const char axis='c', const float align=0) {
      CImgList<T> list;
      list.load_parrec(filename);
      if (list._width==1) return list[0].move_to(*this);
      return assign(list.get_append(axis,align));
    }